

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O1

void serial_test(void **param_1)

{
  _Bool _Var1;
  size_t sVar2;
  char *buf;
  void *__dest;
  ulong __n;
  Roaring t;
  Roaring r1;
  Roaring t2;
  uint32_t values [5];
  roaring_bitmap_t local_b0;
  roaring_bitmap_t local_88;
  roaring_bitmap_t local_60;
  uint32_t local_38 [8];
  
  local_38[0] = 5;
  local_38[1] = 2;
  local_38[2] = 3;
  local_38[3] = 4;
  local_38[4] = 1;
  roaring::Roaring::Roaring((Roaring *)&local_88,5,local_38);
  sVar2 = roaring_bitmap_portable_size_in_bytes(&local_88);
  __n = sVar2 & 0xffffffff;
  buf = (char *)operator_new__(__n);
  roaring_bitmap_portable_serialize(&local_88,buf);
  roaring::Roaring::read((int)&local_b0,buf,1);
  _Var1 = roaring_bitmap_equals(&local_88,&local_b0);
  _assert_true((ulong)_Var1,"r1 == t",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x3f);
  __dest = operator_new__(__n);
  memcpy(__dest,buf,__n);
  roaring::Roaring::read((int)&local_60,__dest,1);
  _Var1 = roaring_bitmap_equals(&local_60,&local_b0);
  _assert_true((ulong)_Var1,"t2 == t",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x43);
  operator_delete__(buf);
  operator_delete__(__dest);
  roaring::Roaring::~Roaring((Roaring *)&local_60);
  roaring::Roaring::~Roaring((Roaring *)&local_b0);
  roaring::Roaring::~Roaring((Roaring *)&local_88);
  return;
}

Assistant:

DEFINE_TEST(serial_test) {
    uint32_t values[] = {5, 2, 3, 4, 1};
    Roaring r1(sizeof(values) / sizeof(uint32_t), values);
    uint32_t serializesize = r1.getSizeInBytes();
    char *serializedbytes = new char[serializesize];
    r1.write(serializedbytes);
    Roaring t = Roaring::read(serializedbytes);
    assert_true(r1 == t);
    char *copy = new char[serializesize];
    memcpy(copy, serializedbytes, serializesize);
    Roaring t2 = Roaring::read(copy);
    assert_true(t2 == t);
    delete[] serializedbytes;
    delete[] copy;
}